

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_suite.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  
  count_null();
  count_boolean();
  count_integer();
  count_real();
  count_string();
  count_wstring();
  count_u16string();
  count_u32string();
  count_array();
  count_array_arithmetic();
  count_map();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    count_null();
    count_boolean();
    count_integer();
    count_real();
    count_string();
    count_wstring();
    count_u16string();
    count_u32string();
    count_array();
    count_array_arithmetic();
    count_map();

    return boost::report_errors();
}